

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O1

void __thiscall ami_nvar_t::nvar_entry_t::~nvar_entry_t(nvar_entry_t *this)

{
  kstream *pkVar1;
  pointer pcVar2;
  nvar_entry_body_t *pnVar3;
  nvar_attributes_t *pnVar4;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__nvar_entry_t_00184958;
  pkVar1 = (this->m__io__raw_body)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  if (pkVar1 != (kstream *)0x0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&pkVar1->m_io_str);
    std::ios_base::~ios_base((ios_base *)&pkVar1->field_0x80);
    operator_delete(pkVar1);
  }
  (this->m__io__raw_body)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  pcVar2 = (this->m__raw_body)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m__raw_body).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_invoke_end_offset)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_invoke_end_offset).field_2) {
    operator_delete(pcVar2);
  }
  pnVar3 = (this->m_body)._M_t.
           super___uniq_ptr_impl<ami_nvar_t::nvar_entry_body_t,_std::default_delete<ami_nvar_t::nvar_entry_body_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_ami_nvar_t::nvar_entry_body_t_*,_std::default_delete<ami_nvar_t::nvar_entry_body_t>_>
           .super__Head_base<0UL,_ami_nvar_t::nvar_entry_body_t_*,_false>._M_head_impl;
  if (pnVar3 != (nvar_entry_body_t *)0x0) {
    (**(code **)((long)(pnVar3->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_body)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::nvar_entry_body_t,_std::default_delete<ami_nvar_t::nvar_entry_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::nvar_entry_body_t_*,_std::default_delete<ami_nvar_t::nvar_entry_body_t>_>
  .super__Head_base<0UL,_ami_nvar_t::nvar_entry_body_t_*,_false>._M_head_impl =
       (nvar_entry_body_t *)0x0;
  pnVar4 = (this->m_attributes)._M_t.
           super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
           .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
  if (pnVar4 != (nvar_attributes_t *)0x0) {
    (**(code **)((long)(pnVar4->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_attributes)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
  .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl =
       (nvar_attributes_t *)0x0;
  pcVar2 = (this->m_signature_rest)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_signature_rest).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_invoke_offset)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_invoke_offset).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

ami_nvar_t::nvar_entry_t::~nvar_entry_t() {
    _clean_up();
}